

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VehicleState.cc
# Opt level: O0

MatrixXd * __thiscall
VehicleState::Propagator::GetRangeAndRateJac(Propagator *this,Vector3d *pos_station_ecef)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  Scalar *pSVar6;
  Scalar *pSVar7;
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  *this_00;
  long in_RSI;
  MatrixXd *in_RDI;
  RealScalar RVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double rel32;
  Vector3d rel_vel;
  Vector3d rel_pos;
  Vector3d vel_station;
  Vector3d pos_station;
  Matrix3d R_ecef2eci;
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  matvec;
  Vector3d vel_craft;
  Vector3d pos_craft;
  double earthrot;
  double JD_UTC;
  MatrixXd *H;
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  *in_stack_00000560;
  MatrixXd *in_stack_00000568;
  MatrixXd *in_stack_00000570;
  double in_stack_00000578;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffaa8;
  DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *in_stack_fffffffffffffab0;
  DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *this_01;
  allocator_type *in_stack_fffffffffffffab8;
  value_type *in_stack_fffffffffffffac0;
  size_type in_stack_fffffffffffffac8;
  Scalar SVar15;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffad0;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffad8;
  
  dVar9 = *(double *)(in_RSI + 200);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffab0,
             (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffaa8);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffab0,
             (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffaa8);
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity
            ((Index)in_stack_fffffffffffffad8,(Index)in_stack_fffffffffffffad0);
  Eigen::Matrix<double,3,3,0,3,3>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffffab0,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)in_stack_fffffffffffffaa8);
  std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::allocator
            ((allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)0x139b0d);
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            *)in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,in_stack_fffffffffffffac0,
           in_stack_fffffffffffffab8);
  std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::~allocator
            ((allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)0x139b3e);
  Util::ECEF2ECI(in_stack_00000578,in_stack_00000570,in_stack_00000568,in_stack_00000560);
  Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
            ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffffab0,
             in_stack_fffffffffffffaa8);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffab0,
             (EigenBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
              *)in_stack_fffffffffffffaa8);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0x139be0);
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffffab0,(Index)in_stack_fffffffffffffaa8);
  dVar10 = *pSVar6;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffffab0,(Index)in_stack_fffffffffffffaa8);
  *pSVar6 = -dVar9 * dVar10;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffffab0,(Index)in_stack_fffffffffffffaa8);
  dVar10 = *pSVar6;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffffab0,(Index)in_stack_fffffffffffffaa8);
  *pSVar6 = dVar9 * dVar10;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffffab0,(Index)in_stack_fffffffffffffaa8);
  *pSVar6 = 0.0;
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
            (in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffab0,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)in_stack_fffffffffffffaa8);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
            (in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffab0,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)in_stack_fffffffffffffaa8);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero
            ((Index)in_stack_fffffffffffffab8,(Index)in_stack_fffffffffffffab0);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffab0,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)in_stack_fffffffffffffaa8);
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffffab0,(Index)in_stack_fffffffffffffaa8);
  dVar9 = *pSVar6;
  RVar8 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm(in_stack_fffffffffffffaa8);
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     (in_stack_fffffffffffffab0,(Index)in_stack_fffffffffffffaa8,0x139e37);
  *pSVar7 = dVar9 / RVar8;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffffab0,(Index)in_stack_fffffffffffffaa8);
  dVar9 = *pSVar6;
  RVar8 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm(in_stack_fffffffffffffaa8);
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     (in_stack_fffffffffffffab0,(Index)in_stack_fffffffffffffaa8,0x139ed4);
  *pSVar7 = dVar9 / RVar8;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffffab0,(Index)in_stack_fffffffffffffaa8);
  dVar9 = *pSVar6;
  RVar8 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm(in_stack_fffffffffffffaa8);
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     (in_stack_fffffffffffffab0,(Index)in_stack_fffffffffffffaa8,0x139f71);
  *pSVar7 = dVar9 / RVar8;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffffab0,(Index)in_stack_fffffffffffffaa8);
  dVar9 = pow(*pSVar6,2.0);
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffffab0,(Index)in_stack_fffffffffffffaa8);
  dVar10 = pow(*pSVar6,2.0);
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffffab0,(Index)in_stack_fffffffffffffaa8);
  dVar11 = pow(*pSVar6,2.0);
  dVar12 = pow(dVar9 + dVar10 + dVar11,1.5);
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffffab0,(Index)in_stack_fffffffffffffaa8);
  dVar9 = *pSVar6;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffffab0,(Index)in_stack_fffffffffffffaa8);
  dVar13 = pow(*pSVar6,2.0);
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffffab0,(Index)in_stack_fffffffffffffaa8);
  dVar10 = *pSVar6;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffffab0,(Index)in_stack_fffffffffffffaa8);
  dVar11 = *pSVar6;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffffab0,(Index)in_stack_fffffffffffffaa8);
  dVar1 = *pSVar6;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffffab0,(Index)in_stack_fffffffffffffaa8);
  dVar2 = *pSVar6;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffffab0,(Index)in_stack_fffffffffffffaa8);
  dVar14 = pow(*pSVar6,2.0);
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffffab0,(Index)in_stack_fffffffffffffaa8);
  dVar3 = *pSVar6;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffffab0,(Index)in_stack_fffffffffffffaa8);
  dVar4 = *pSVar6;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffffab0,(Index)in_stack_fffffffffffffaa8);
  dVar5 = *pSVar6;
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     (in_stack_fffffffffffffab0,(Index)in_stack_fffffffffffffaa8,0x13a311);
  *pSVar7 = ((dVar2 * dVar14 + (dVar9 * dVar13 - dVar10 * dVar11 * dVar1)) - dVar3 * dVar4 * dVar5)
            / dVar12;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffffab0,(Index)in_stack_fffffffffffffaa8);
  dVar9 = *pSVar6;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffffab0,(Index)in_stack_fffffffffffffaa8);
  dVar13 = pow(*pSVar6,2.0);
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffffab0,(Index)in_stack_fffffffffffffaa8);
  dVar10 = *pSVar6;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffffab0,(Index)in_stack_fffffffffffffaa8);
  dVar11 = *pSVar6;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffffab0,(Index)in_stack_fffffffffffffaa8);
  dVar1 = *pSVar6;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffffab0,(Index)in_stack_fffffffffffffaa8);
  dVar2 = *pSVar6;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffffab0,(Index)in_stack_fffffffffffffaa8);
  dVar14 = pow(*pSVar6,2.0);
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffffab0,(Index)in_stack_fffffffffffffaa8);
  dVar3 = *pSVar6;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffffab0,(Index)in_stack_fffffffffffffaa8);
  dVar4 = *pSVar6;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffffab0,(Index)in_stack_fffffffffffffaa8);
  dVar5 = *pSVar6;
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     (in_stack_fffffffffffffab0,(Index)in_stack_fffffffffffffaa8,0x13a5cb);
  *pSVar7 = ((dVar2 * dVar14 + (dVar9 * dVar13 - dVar10 * dVar11 * dVar1)) - dVar3 * dVar4 * dVar5)
            / dVar12;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffffab0,(Index)in_stack_fffffffffffffaa8);
  dVar9 = *pSVar6;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffffab0,(Index)in_stack_fffffffffffffaa8);
  dVar13 = pow(*pSVar6,2.0);
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffffab0,(Index)in_stack_fffffffffffffaa8);
  dVar10 = *pSVar6;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffffab0,(Index)in_stack_fffffffffffffaa8);
  dVar11 = *pSVar6;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffffab0,(Index)in_stack_fffffffffffffaa8);
  dVar1 = *pSVar6;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffffab0,(Index)in_stack_fffffffffffffaa8);
  dVar2 = *pSVar6;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffffab0,(Index)in_stack_fffffffffffffaa8);
  dVar14 = pow(*pSVar6,2.0);
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffffab0,(Index)in_stack_fffffffffffffaa8);
  dVar3 = *pSVar6;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffffab0,(Index)in_stack_fffffffffffffaa8);
  dVar4 = *pSVar6;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffffab0,(Index)in_stack_fffffffffffffaa8);
  dVar5 = *pSVar6;
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     (in_stack_fffffffffffffab0,(Index)in_stack_fffffffffffffaa8,0x13a86d);
  *pSVar7 = ((dVar2 * dVar14 + (dVar9 * dVar13 - dVar10 * dVar11 * dVar1)) - dVar3 * dVar4 * dVar5)
            / dVar12;
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     (in_stack_fffffffffffffab0,(Index)in_stack_fffffffffffffaa8,0x13a897);
  SVar15 = *pSVar7;
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     (in_stack_fffffffffffffab0,(Index)in_stack_fffffffffffffaa8,0x13a8c4);
  *pSVar7 = SVar15;
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     (in_stack_fffffffffffffab0,(Index)in_stack_fffffffffffffaa8,0x13a8f0);
  SVar15 = *pSVar7;
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     (in_stack_fffffffffffffab0,(Index)in_stack_fffffffffffffaa8,0x13a91d);
  *pSVar7 = SVar15;
  this_00 = (vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
             *)Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         (in_stack_fffffffffffffab0,(Index)in_stack_fffffffffffffaa8,0x13a949);
  this_01 = (DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
            (this_00->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     (this_01,(Index)in_stack_fffffffffffffaa8,0x13a976);
  *pSVar7 = (Scalar)this_01;
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::~vector(this_00);
  return in_RDI;
}

Assistant:

Eigen::MatrixXd Propagator::GetRangeAndRateJac(Eigen::Vector3d pos_station_ecef){

		//locals
		double JD_UTC = this->t_JD_ + this->t_/(24.0*60.0*60.0); //current UTC Julian Date in days
		double earthrot = this->earthrotationspeed_;
		Eigen::Vector3d pos_craft = this->pos_;
		Eigen::Vector3d vel_craft = this->vel_;
		std::vector<Eigen::Matrix3d> matvec(4, Eigen::Matrix3d::Identity(3,3));
		Eigen::Matrix3d R_ecef2eci = Util::ECEF2ECI(JD_UTC, this->gravmodel_->nut80ptr_, this->gravmodel_->iau1980ptr_, &matvec); //matrix rotating from ECEF2ECI

		//convert station position to ECI
		Eigen::Vector3d pos_station = R_ecef2eci*pos_station_ecef;

		//station ECI velocity
		Eigen::Vector3d vel_station;
		vel_station[0] = -1.0*earthrot*pos_station[1];
		vel_station[1] = earthrot*pos_station[0];
		vel_station[2] = 0.0;

		//relative position and velocity
		Eigen::Vector3d rel_pos = pos_craft - pos_station;
		Eigen::Vector3d rel_vel  = vel_craft - vel_station;

		//initialize H
		Eigen::MatrixXd H = Eigen::MatrixXd::Zero(2,6);

		//range partials
		H(0,0) = rel_pos[0]/rel_pos.norm();
		H(0,1) = rel_pos[1]/rel_pos.norm();
		H(0,2) = rel_pos[2]/rel_pos.norm();

		//range rate partials
		double rel32 = pow(pow(rel_pos[0],2.0) + pow(rel_pos[1],2.0) + pow(rel_pos[2],2.0), 1.5);
		H(1,0) = (rel_vel[0]*pow(rel_pos[1],2.0) - rel_pos[0]*rel_vel[1]*rel_pos[1] + rel_vel[0]*pow(rel_pos[2],2.0) - rel_pos[0]*rel_vel[2]*rel_pos[2])/rel32;
		H(1,1) = (rel_vel[1]*pow(rel_pos[0],2.0) - rel_pos[1]*rel_vel[0]*rel_pos[0] + rel_vel[1]*pow(rel_pos[2],2.0) - rel_pos[1]*rel_vel[2]*rel_pos[2])/rel32;
		H(1,2) = (rel_vel[2]*pow(rel_pos[1],2.0) - rel_pos[2]*rel_vel[0]*rel_pos[0] + rel_vel[2]*pow(rel_pos[1],2.0) - rel_pos[2]*rel_vel[1]*rel_pos[1])/rel32;
		H(1,3) = H(0,0);
		H(1,4) = H(0,1);
		H(1,5) = H(0,2);

		return H;
	}